

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fir1.cpp
# Opt level: O3

void __thiscall Fir1::Fir1(Fir1 *this,uint number_of_taps,double value)

{
  ulong __n;
  undefined1 auVar1 [16];
  double *pdVar2;
  double *__s;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  long lVar7;
  
  uVar3 = (ulong)number_of_taps;
  __n = uVar3 * 8;
  pdVar2 = (double *)operator_new__(__n);
  this->coefficients = pdVar2;
  __s = (double *)operator_new__(__n);
  this->buffer = __s;
  this->taps = number_of_taps;
  this->offset = 0;
  this->mu = 0.0;
  if (number_of_taps != 0) {
    uVar4 = 0;
    memset(__s,0,__n);
    auVar1 = _DAT_001041b0;
    lVar7 = uVar3 - 1;
    auVar5._8_4_ = (int)lVar7;
    auVar5._0_8_ = lVar7;
    auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar5 = auVar5 ^ _DAT_001041b0;
    auVar6 = _DAT_001041a0;
    do {
      auVar8 = auVar6 ^ auVar1;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        *(double *)((long)pdVar2 + uVar4) = value;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        *(double *)((long)pdVar2 + uVar4 + 8) = value;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      uVar4 = uVar4 + 0x10;
    } while ((uVar3 * 8 + 8 & 0xfffffffffffffff0) != uVar4);
  }
  return;
}

Assistant:

Fir1::Fir1(unsigned number_of_taps, double value) :
	coefficients(new double[number_of_taps]),
	buffer(new double[number_of_taps]),  
	taps(number_of_taps) {
	for(unsigned int i=0;i<number_of_taps;i++) {
	        coefficients[i] = value;
		buffer[i] = 0;
	}
}